

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O1

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenUnionUnPack_ObjectAPI
          (CSharpGenerator *this,EnumDef *enum_def,string *code_ptr,string *camel_name,
          string *camel_name_short,bool is_vector)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  EnumVal *pEVar3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  size_type *psVar7;
  ulong *puVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  undefined3 in_register_00000089;
  EnumDef *def;
  pointer ppEVar14;
  Type *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string indent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  string type_suffix;
  string class_member;
  string func_suffix;
  string varialbe_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  long local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  string local_158;
  string *local_138;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  long *local_d0;
  char *local_c8;
  long local_c0 [2];
  long *local_b0;
  size_t local_a8;
  long local_a0 [2];
  EnumDef *local_90;
  string *local_88;
  CSharpGenerator *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined4 local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_138 = code_ptr;
  local_88 = camel_name;
  local_80 = this;
  std::operator+(&local_50,"_o.",camel_name);
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Value","");
  if ((local_a8 == (enum_def->super_Definition).name._M_string_length) &&
     ((local_a8 == 0 ||
      (iVar4 = bcmp(local_b0,(enum_def->super_Definition).name._M_dataplus._M_p,local_a8),
      iVar4 == 0)))) {
    std::__cxx11::string::append((char *)&local_b0);
  }
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"()","");
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_90 = enum_def;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"    ","");
  if (is_vector) {
    std::operator+(&local_1b8,"_o_",local_88);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_1b8);
    paVar1 = &local_1b8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_replace((ulong)&local_d0,0,local_c8,0x36e41f);
    std::__cxx11::string::_M_replace((ulong)&local_78,0,(char *)local_78._M_string_length,0x36e41f);
    std::__cxx11::string::_M_replace
              ((ulong)&local_110,0,(char *)local_110._M_string_length,0x3698ca);
    if (!is_vector) goto LAB_001c57fd;
    local_178 = &local_168;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_178,local_110._M_dataplus._M_p,
               (char *)(local_110._M_string_length + (long)local_110._M_dataplus._M_p));
    std::__cxx11::string::append((char *)&local_178);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_178,(ulong)local_50._M_dataplus._M_p);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_198.field_2._M_allocated_capacity = *psVar7;
      local_198.field_2._8_8_ = plVar5[3];
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    }
    else {
      local_198.field_2._M_allocated_capacity = *psVar7;
      local_198._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_198._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_198);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8.field_2._8_8_ = plVar5[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_1b8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_138,(ulong)local_1b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    def = local_90;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    _Var13._M_p = (pointer)local_178;
    if (local_178 == &local_168) goto LAB_001c5990;
  }
  else {
LAB_001c57fd:
    std::operator+(&local_198,&local_110,&local_50);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_198);
    def = local_90;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8.field_2._8_8_ = plVar5[3];
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_1b8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_138,(ulong)local_1b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    local_168._M_allocated_capacity = local_198.field_2._M_allocated_capacity;
    _Var13._M_p = local_198._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p == &local_198.field_2) goto LAB_001c5990;
  }
  operator_delete(_Var13._M_p,local_168._M_allocated_capacity + 1);
LAB_001c5990:
  NamespacedName_abi_cxx11_(&local_198,local_80,&def->super_Definition);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_198);
  paVar1 = &local_1b8.field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_1b8.field_2._M_allocated_capacity = *psVar7;
    local_1b8.field_2._8_8_ = plVar5[3];
    local_1b8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1b8.field_2._M_allocated_capacity = *psVar7;
    local_1b8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1b8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_138,(ulong)local_1b8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  paVar10 = &local_198.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar10) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_f0,&local_110,&local_50);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
  paVar11 = &local_130.field_2;
  puVar8 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_130.field_2._M_allocated_capacity = *puVar8;
    local_130.field_2._8_8_ = plVar5[3];
    local_130._M_dataplus._M_p = (pointer)paVar11;
  }
  else {
    local_130.field_2._M_allocated_capacity = *puVar8;
    local_130._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_130._M_string_length = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_54 = CONCAT31(in_register_00000089,is_vector);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_130,(ulong)(camel_name_short->_M_dataplus)._M_p);
  paVar2 = &local_158.field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_158.field_2._M_allocated_capacity = *psVar7;
    local_158.field_2._8_8_ = plVar5[3];
    local_158._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_158.field_2._M_allocated_capacity = *psVar7;
    local_158._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_158._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_158);
  local_178 = &local_168;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar9) {
    local_168._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_168._8_8_ = plVar5[3];
  }
  else {
    local_168._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5;
  }
  local_170 = plVar5[1];
  *plVar5 = (long)paVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_d0);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_198.field_2._M_allocated_capacity = *psVar7;
    local_198.field_2._8_8_ = plVar5[3];
    local_198._M_dataplus._M_p = (pointer)paVar10;
  }
  else {
    local_198.field_2._M_allocated_capacity = *psVar7;
    local_198._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_198._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_198);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_1b8.field_2._M_allocated_capacity = *psVar7;
    local_1b8.field_2._8_8_ = plVar5[3];
    local_1b8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1b8.field_2._M_allocated_capacity = *psVar7;
    local_1b8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1b8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_138,(ulong)local_1b8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar10) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,local_168._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar11) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)paVar11;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,local_110._M_dataplus._M_p,
             (char *)(local_110._M_string_length + (long)local_110._M_dataplus._M_p));
  std::__cxx11::string::append((char *)&local_130);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_130,(ulong)(camel_name_short->_M_dataplus)._M_p);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_158.field_2._M_allocated_capacity = *psVar7;
    local_158.field_2._8_8_ = plVar5[3];
    local_158._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_158.field_2._M_allocated_capacity = *psVar7;
    local_158._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_158._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_158);
  local_178 = &local_168;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar9) {
    local_168._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_168._8_8_ = plVar5[3];
  }
  else {
    local_168._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5;
  }
  local_170 = plVar5[1];
  *plVar5 = (long)paVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_d0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_198.field_2._M_allocated_capacity = *puVar8;
    local_198.field_2._8_8_ = plVar5[3];
    local_198._M_dataplus._M_p = (pointer)paVar10;
  }
  else {
    local_198.field_2._M_allocated_capacity = *puVar8;
    local_198._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_198._M_string_length = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_198);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_1b8.field_2._M_allocated_capacity = *psVar7;
    local_1b8.field_2._8_8_ = plVar5[3];
    local_1b8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1b8.field_2._M_allocated_capacity = *psVar7;
    local_1b8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1b8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_138,(ulong)local_1b8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar10) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,local_168._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar11) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  ppEVar14 = (local_90->vals).vec.
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppEVar14 !=
      (local_90->vals).vec.
      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pEVar3 = *ppEVar14;
      if ((pEVar3->union_type).base_type == BASE_TYPE_NONE) {
        local_1b8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,local_110._M_dataplus._M_p,
                   (char *)(local_110._M_string_length + (long)local_110._M_dataplus._M_p));
        std::__cxx11::string::append((char *)&local_1b8);
        std::__cxx11::string::_M_append((char *)local_138,(ulong)local_1b8._M_dataplus._M_p);
      }
      else {
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,local_110._M_dataplus._M_p,
                   (char *)(local_110._M_string_length + (long)local_110._M_dataplus._M_p));
        std::__cxx11::string::append((char *)&local_130);
        NamespacedName_abi_cxx11_(&local_f0,local_80,&local_90->super_Definition);
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          uVar12 = local_130.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_f0._M_string_length + local_130._M_string_length) {
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            uVar12 = local_f0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < local_f0._M_string_length + local_130._M_string_length)
          goto LAB_001c5feb;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_f0,0,(char *)0x0,(ulong)local_130._M_dataplus._M_p);
        }
        else {
LAB_001c5feb:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_130,(ulong)local_f0._M_dataplus._M_p);
        }
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        psVar7 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_158.field_2._M_allocated_capacity = *psVar7;
          local_158.field_2._8_8_ = puVar6[3];
        }
        else {
          local_158.field_2._M_allocated_capacity = *psVar7;
          local_158._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_158._M_string_length = puVar6[1];
        *puVar6 = psVar7;
        puVar6[1] = 0;
        *(undefined1 *)psVar7 = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_158);
        local_178 = &local_168;
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 == paVar10) {
          local_168._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_168._8_8_ = plVar5[3];
        }
        else {
          local_168._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar5;
        }
        local_170 = plVar5[1];
        *plVar5 = (long)paVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_178,(ulong)(pEVar3->name)._M_dataplus._M_p);
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_198.field_2._M_allocated_capacity = *psVar7;
          local_198.field_2._8_8_ = plVar5[3];
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        }
        else {
          local_198.field_2._M_allocated_capacity = *psVar7;
          local_198._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_198._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_198);
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_1b8.field_2._M_allocated_capacity = *psVar7;
          local_1b8.field_2._8_8_ = plVar5[3];
          local_1b8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_1b8.field_2._M_allocated_capacity = *psVar7;
          local_1b8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_1b8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_138,(ulong)local_1b8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if (local_178 != &local_168) {
          operator_delete(local_178,local_168._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,local_110._M_dataplus._M_p,
                   (char *)(local_110._M_string_length + (long)local_110._M_dataplus._M_p));
        std::__cxx11::string::append((char *)&local_f0);
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_f0,(ulong)local_50._M_dataplus._M_p);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        puVar8 = (ulong *)(plVar5 + 2);
        paVar10 = &local_198.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_130.field_2._M_allocated_capacity = *puVar8;
          local_130.field_2._8_8_ = plVar5[3];
        }
        else {
          local_130.field_2._M_allocated_capacity = *puVar8;
          local_130._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_130._M_string_length = plVar5[1];
        *plVar5 = (long)puVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_158.field_2._M_allocated_capacity = *psVar7;
          local_158.field_2._8_8_ = plVar5[3];
        }
        else {
          local_158.field_2._M_allocated_capacity = *psVar7;
          local_158._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_158._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_b0);
        local_178 = &local_168;
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 == paVar11) {
          local_168._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_168._8_8_ = plVar5[3];
        }
        else {
          local_168._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar5;
        }
        local_170 = plVar5[1];
        *plVar5 = (long)paVar11;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_178);
        puVar8 = (ulong *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_198.field_2._M_allocated_capacity = *puVar8;
          local_198.field_2._8_8_ = plVar5[3];
          local_198._M_dataplus._M_p = (pointer)paVar10;
        }
        else {
          local_198.field_2._M_allocated_capacity = *puVar8;
          local_198._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_198._M_string_length = plVar5[1];
        *plVar5 = (long)puVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_198,(ulong)(local_88->_M_dataplus)._M_p);
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_1b8.field_2._M_allocated_capacity = *psVar7;
          local_1b8.field_2._8_8_ = plVar5[3];
          local_1b8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_1b8.field_2._M_allocated_capacity = *psVar7;
          local_1b8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_1b8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_138,(ulong)local_1b8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != paVar10) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if (local_178 != &local_168) {
          operator_delete(local_178,local_168._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        type = &pEVar3->union_type;
        if (type->base_type == BASE_TYPE_STRING) {
          std::operator+(&local_198,"AsString",&local_78);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_198);
          psVar7 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_1b8.field_2._M_allocated_capacity = *psVar7;
            local_1b8.field_2._8_8_ = plVar5[3];
            local_1b8._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_1b8.field_2._M_allocated_capacity = *psVar7;
            local_1b8._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_1b8._M_string_length = plVar5[1];
          *plVar5 = (long)psVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_138,(ulong)local_1b8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          }
          uVar12 = local_198.field_2._M_allocated_capacity;
          _Var13._M_p = local_198._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != paVar10) {
LAB_001c69ed:
            operator_delete(_Var13._M_p,uVar12 + 1);
          }
        }
        else {
          GenTypeGet_abi_cxx11_(&local_158,local_80,type);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,0x388e63);
          local_178 = &local_168;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 == paVar11) {
            local_168._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_168._8_8_ = plVar5[3];
          }
          else {
            local_168._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar5;
          }
          local_170 = plVar5[1];
          *plVar5 = (long)paVar11;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_178);
          psVar7 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_198.field_2._M_allocated_capacity = *psVar7;
            local_198.field_2._8_8_ = plVar5[3];
            local_198._M_dataplus._M_p = (pointer)paVar10;
          }
          else {
            local_198.field_2._M_allocated_capacity = *psVar7;
            local_198._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_198._M_string_length = plVar5[1];
          *plVar5 = (long)psVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_198,(ulong)local_78._M_dataplus._M_p);
          psVar7 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_1b8.field_2._M_allocated_capacity = *psVar7;
            local_1b8.field_2._8_8_ = plVar5[3];
            local_1b8._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_1b8.field_2._M_allocated_capacity = *psVar7;
            local_1b8._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_1b8._M_string_length = plVar5[1];
          *plVar5 = (long)psVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_138,(ulong)local_1b8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != paVar10) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if (local_178 != &local_168) {
            operator_delete(local_178,local_168._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_1b8,".HasValue ? this.",local_88);
          std::__cxx11::string::_M_append((char *)local_138,(ulong)local_1b8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          }
          GenTypeGet_abi_cxx11_(&local_130,local_80,type);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x388e63);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          psVar7 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_158.field_2._M_allocated_capacity = *psVar7;
            local_158.field_2._8_8_ = plVar5[3];
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar7;
            local_158._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_158._M_string_length = plVar5[1];
          *plVar5 = (long)psVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_158);
          local_178 = &local_168;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 == paVar11) {
            local_168._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_168._8_8_ = plVar5[3];
          }
          else {
            local_168._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar5;
          }
          local_170 = plVar5[1];
          *plVar5 = (long)paVar11;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_178,(ulong)local_78._M_dataplus._M_p);
          puVar8 = (ulong *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar8) {
            local_198.field_2._M_allocated_capacity = *puVar8;
            local_198.field_2._8_8_ = plVar5[3];
            local_198._M_dataplus._M_p = (pointer)paVar10;
          }
          else {
            local_198.field_2._M_allocated_capacity = *puVar8;
            local_198._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_198._M_string_length = plVar5[1];
          *plVar5 = (long)puVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_198);
          psVar7 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_1b8.field_2._M_allocated_capacity = *psVar7;
            local_1b8.field_2._8_8_ = plVar5[3];
            local_1b8._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_1b8.field_2._M_allocated_capacity = *psVar7;
            local_1b8._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_1b8._M_string_length = plVar5[1];
          *plVar5 = (long)psVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_138,(ulong)local_1b8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != paVar10) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if (local_178 != &local_168) {
            operator_delete(local_178,local_168._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          uVar12 = local_130.field_2._M_allocated_capacity;
          _Var13._M_p = local_130._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) goto LAB_001c69ed;
        }
        local_1b8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,local_110._M_dataplus._M_p,
                   (char *)(local_110._M_string_length + (long)local_110._M_dataplus._M_p));
        std::__cxx11::string::append((char *)&local_1b8);
        std::__cxx11::string::_M_append((char *)local_138,(ulong)local_1b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      ppEVar14 = ppEVar14 + 1;
    } while (ppEVar14 !=
             (local_90->vals).vec.
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,local_110._M_dataplus._M_p,
             (char *)(local_110._M_string_length + (long)local_110._M_dataplus._M_p));
  std::__cxx11::string::append((char *)&local_1b8);
  std::__cxx11::string::_M_append((char *)local_138,(ulong)local_1b8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((char)local_54 != '\0') {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,local_110._M_dataplus._M_p,
               (char *)(local_110._M_string_length + (long)local_110._M_dataplus._M_p));
    std::__cxx11::string::append((char *)&local_130);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_130,(ulong)(local_88->_M_dataplus)._M_p);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_158.field_2._M_allocated_capacity = *psVar7;
      local_158.field_2._8_8_ = plVar5[3];
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar7;
      local_158._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_158._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_158);
    local_178 = &local_168;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 == paVar10) {
      local_168._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_168._8_8_ = plVar5[3];
    }
    else {
      local_168._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5;
    }
    local_170 = plVar5[1];
    *plVar5 = (long)paVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_178,(ulong)local_50._M_dataplus._M_p);
    puVar8 = (ulong *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_198.field_2._M_allocated_capacity = *puVar8;
      local_198.field_2._8_8_ = plVar5[3];
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    }
    else {
      local_198.field_2._M_allocated_capacity = *puVar8;
      local_198._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_198._M_string_length = plVar5[1];
    *plVar5 = (long)puVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_198);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8.field_2._8_8_ = plVar5[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_1b8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_138,(ulong)local_1b8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    if (local_178 != &local_168) {
      operator_delete(local_178,local_168._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenUnionUnPack_ObjectAPI(const EnumDef &enum_def, std::string *code_ptr,
                                const std::string &camel_name,
                                const std::string &camel_name_short,
                                bool is_vector) const {
    auto &code = *code_ptr;
    std::string varialbe_name = "_o." + camel_name;
    std::string class_member = "Value";
    if (class_member == enum_def.name) class_member += "_";
    std::string type_suffix = "";
    std::string func_suffix = "()";
    std::string indent = "    ";
    if (is_vector) {
      varialbe_name = "_o_" + camel_name;
      type_suffix = "(_j)";
      func_suffix = "(_j)";
      indent = "      ";
    }
    if (is_vector) {
      code += indent + "var " + varialbe_name + " = new ";
    } else {
      code += indent + varialbe_name + " = new ";
    }
    code += NamespacedName(enum_def) + "Union();\n";
    code += indent + varialbe_name + ".Type = this." + camel_name_short +
            "Type" + type_suffix + ";\n";
    code += indent + "switch (this." + camel_name_short + "Type" + type_suffix +
            ") {\n";
    for (auto eit = enum_def.Vals().begin(); eit != enum_def.Vals().end();
         ++eit) {
      auto &ev = **eit;
      if (ev.union_type.base_type == BASE_TYPE_NONE) {
        code += indent + "  default: break;\n";
      } else {
        code += indent + "  case " + NamespacedName(enum_def) + "." + ev.name +
                ":\n";
        code += indent + "    " + varialbe_name + "." + class_member +
                " = this." + camel_name;
        if (IsString(ev.union_type)) {
          code += "AsString" + func_suffix + ";\n";
        } else {
          code += "<" + GenTypeGet(ev.union_type) + ">" + func_suffix;
          code += ".HasValue ? this." + camel_name;
          code += "<" + GenTypeGet(ev.union_type) + ">" + func_suffix +
                  ".Value.UnPack() : null;\n";
        }
        code += indent + "    break;\n";
      }
    }
    code += indent + "}\n";
    if (is_vector) {
      code += indent + "_o." + camel_name + ".Add(" + varialbe_name + ");\n";
    }
  }